

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

int fy_node_mapping_sort_cmp_no_qsort_r(void *a,void *b)

{
  int iVar1;
  void *b_local;
  void *a_local;
  
  iVar1 = fy_node_mapping_sort_cmp(a,b,fy_node_mapping_sort_ctx_no_qsort_r);
  return iVar1;
}

Assistant:

static int fy_node_mapping_sort_cmp_no_qsort_r(const void *a, const void *b) {
#ifdef __APPLE__
                                                                                                                            return fy_node_mapping_sort_cmp(
			fy_node_mapping_sort_ctx_no_qsort_r,
			a, b);
#else
    return fy_node_mapping_sort_cmp(a, b,
                                    fy_node_mapping_sort_ctx_no_qsort_r);
#endif
}